

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::merge_const_port_assignment(Generator *top)

{
  undefined1 local_58 [8];
  MergeConstPortVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  MergeConstPortVisitor::MergeConstPortVisitor((MergeConstPortVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  MergeConstPortVisitor::~MergeConstPortVisitor((MergeConstPortVisitor *)local_58);
  return;
}

Assistant:

void merge_const_port_assignment(Generator* top) {
    MergeConstPortVisitor visitor;
    visitor.visit_generator_root_p(top);
}